

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

void __thiscall
wallet::CoinsResult::Erase
          (CoinsResult *this,
          unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
          *coins_to_remove)

{
  _Rb_tree_header *p_Var1;
  CScript *pCVar2;
  COutput *pCVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int64_t iVar7;
  CAmount CVar8;
  undefined7 uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined5 uVar15;
  bool bVar16;
  _Base_ptr p_Var17;
  __normal_iterator<wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  _Var18;
  __normal_iterator<wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  __first;
  __normal_iterator<wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  _Var19;
  COutput *pCVar20;
  long lVar21;
  long in_FS_OFFSET;
  byte bVar22;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *local_58;
  CoinsResult *local_50;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *local_48;
  CoinsResult *local_40;
  long local_38;
  
  bVar22 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var17 = (this->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->coins)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var17 != p_Var1) {
    do {
      _Var18._M_current = (COutput *)p_Var17[1]._M_parent;
      pCVar3 = (COutput *)p_Var17[1]._M_left;
      lVar21 = ((long)pCVar3 - (long)_Var18._M_current >> 5) * -0x3333333333333333 >> 2;
      local_58 = coins_to_remove;
      local_50 = this;
      local_48 = coins_to_remove;
      local_40 = this;
      if (0 < lVar21) {
        lVar21 = lVar21 + 1;
        do {
          bVar16 = __gnu_cxx::__ops::
                   _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                   ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                                 *)&local_48,_Var18);
          __first._M_current = _Var18._M_current;
          if (bVar16) goto LAB_0023daef;
          bVar16 = __gnu_cxx::__ops::
                   _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                   ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                                 *)&local_48,_Var18._M_current + 1);
          __first._M_current = _Var18._M_current + 1;
          if (bVar16) goto LAB_0023daef;
          bVar16 = __gnu_cxx::__ops::
                   _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                   ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                                 *)&local_48,_Var18._M_current + 2);
          __first._M_current = _Var18._M_current + 2;
          if (bVar16) goto LAB_0023daef;
          bVar16 = __gnu_cxx::__ops::
                   _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                   ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                                 *)&local_48,_Var18._M_current + 3);
          __first._M_current = _Var18._M_current + 3;
          if (bVar16) goto LAB_0023daef;
          _Var18._M_current = _Var18._M_current + 4;
          lVar21 = lVar21 + -1;
        } while (1 < lVar21);
      }
      lVar21 = ((long)pCVar3 - (long)_Var18._M_current >> 5) * -0x3333333333333333;
      if (lVar21 == 1) {
LAB_0023dadb:
        bVar16 = __gnu_cxx::__ops::
                 _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                 ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                               *)&local_48,_Var18);
        __first._M_current = _Var18._M_current;
        if (!bVar16) {
          __first._M_current = pCVar3;
        }
      }
      else if (lVar21 == 2) {
LAB_0023dac5:
        bVar16 = __gnu_cxx::__ops::
                 _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                 ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                               *)&local_48,_Var18);
        __first._M_current = _Var18._M_current;
        if (!bVar16) {
          _Var18._M_current = _Var18._M_current + 1;
          goto LAB_0023dadb;
        }
      }
      else {
        __first._M_current = pCVar3;
        if ((lVar21 == 3) &&
           (bVar16 = __gnu_cxx::__ops::
                     _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                     ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                                   *)&local_48,_Var18), __first._M_current = _Var18._M_current,
           !bVar16)) {
          _Var18._M_current = _Var18._M_current + 1;
          goto LAB_0023dac5;
        }
      }
LAB_0023daef:
      _Var18._M_current = __first._M_current + 1;
      if (_Var18._M_current != pCVar3 && __first._M_current != pCVar3) {
        do {
          bVar16 = __gnu_cxx::__ops::
                   _Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::$_0>
                   ::operator()((_Iter_pred<wallet::CoinsResult::Erase(std::unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>const&)::__0>
                                 *)&local_58,_Var18);
          if (!bVar16) {
            _Var19._M_current = _Var18._M_current;
            pCVar20 = __first._M_current;
            for (lVar21 = 8; lVar21 != 0; lVar21 = lVar21 + -1) {
              (pCVar20->effective_value).super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload =
                   ((_Var19._M_current)->effective_value).super__Optional_base<long,_true,_true>.
                   _M_payload.super__Optional_payload_base<long>._M_payload;
              _Var19._M_current = _Var19._M_current + (ulong)bVar22 * -0x10 + 8;
              pCVar20 = (COutput *)((long)pCVar20 + (ulong)bVar22 * -0x10 + 8);
            }
            ((__first._M_current)->outpoint).n = ((_Var18._M_current)->outpoint).n;
            ((__first._M_current)->txout).nValue = ((_Var18._M_current)->txout).nValue;
            pCVar2 = &((__first._M_current)->txout).scriptPubKey;
            if (0x1c < ((__first._M_current)->txout).scriptPubKey.super_CScriptBase._size) {
              free((pCVar2->super_CScriptBase)._union.indirect_contents.indirect);
            }
            pcVar4 = ((_Var18._M_current)->txout).scriptPubKey.super_CScriptBase._union.
                     indirect_contents.indirect;
            uVar5 = *(undefined8 *)
                     ((long)&((_Var18._M_current)->txout).scriptPubKey.super_CScriptBase._union + 8)
            ;
            uVar6 = *(undefined8 *)
                     ((long)&((_Var18._M_current)->txout).scriptPubKey.super_CScriptBase._union +
                     0x14);
            *(undefined8 *)
             ((long)&((__first._M_current)->txout).scriptPubKey.super_CScriptBase._union + 0xc) =
                 *(undefined8 *)
                  ((long)&((_Var18._M_current)->txout).scriptPubKey.super_CScriptBase._union + 0xc);
            *(undefined8 *)
             ((long)&((__first._M_current)->txout).scriptPubKey.super_CScriptBase._union + 0x14) =
                 uVar6;
            (pCVar2->super_CScriptBase)._union.indirect_contents.indirect = pcVar4;
            *(undefined8 *)
             ((long)&((__first._M_current)->txout).scriptPubKey.super_CScriptBase._union + 8) =
                 uVar5;
            ((__first._M_current)->txout).scriptPubKey.super_CScriptBase._size =
                 ((_Var18._M_current)->txout).scriptPubKey.super_CScriptBase._size;
            ((_Var18._M_current)->txout).scriptPubKey.super_CScriptBase._size = 0;
            iVar10 = (_Var18._M_current)->depth;
            iVar11 = (_Var18._M_current)->input_bytes;
            bVar12 = (_Var18._M_current)->spendable;
            bVar13 = (_Var18._M_current)->solvable;
            bVar14 = (_Var18._M_current)->safe;
            uVar15 = *(undefined5 *)&(_Var18._M_current)->field_0x7b;
            iVar7 = (_Var18._M_current)->time;
            bVar16 = (_Var18._M_current)->from_me;
            uVar9 = *(undefined7 *)&(_Var18._M_current)->field_0x89;
            CVar8 = (_Var18._M_current)->ancestor_bump_fees;
            (__first._M_current)->long_term_fee = (_Var18._M_current)->long_term_fee;
            (__first._M_current)->ancestor_bump_fees = CVar8;
            (__first._M_current)->time = iVar7;
            (__first._M_current)->from_me = bVar16;
            *(undefined7 *)&(__first._M_current)->field_0x89 = uVar9;
            (__first._M_current)->depth = iVar10;
            (__first._M_current)->input_bytes = iVar11;
            (__first._M_current)->spendable = bVar12;
            (__first._M_current)->solvable = bVar13;
            (__first._M_current)->safe = bVar14;
            *(undefined5 *)&(__first._M_current)->field_0x7b = uVar15;
            __first._M_current = __first._M_current + 1;
          }
          _Var18._M_current = _Var18._M_current + 1;
        } while (_Var18._M_current != pCVar3);
      }
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::_M_erase
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&p_Var17[1]._M_parent,
                 (iterator)__first._M_current,(COutput *)p_Var17[1]._M_left);
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != p_Var1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CoinsResult::Erase(const std::unordered_set<COutPoint, SaltedOutpointHasher>& coins_to_remove)
{
    for (auto& [type, vec] : coins) {
        auto remove_it = std::remove_if(vec.begin(), vec.end(), [&](const COutput& coin) {
            // remove it if it's on the set
            if (coins_to_remove.count(coin.outpoint) == 0) return false;

            // update cached amounts
            total_amount -= coin.txout.nValue;
            if (coin.HasEffectiveValue()) total_effective_amount = *total_effective_amount - coin.GetEffectiveValue();
            return true;
        });
        vec.erase(remove_it, vec.end());
    }
}